

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall ThreadPool::stop(ThreadPool *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer ptVar3;
  int iVar4;
  pointer ptVar5;
  pointer ptVar6;
  
  clear(this);
  if ((this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    puVar1 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      memset(puVar1,1,(long)puVar2 - (long)puVar1);
    }
    puVar1 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      memset(puVar1,1,(long)puVar2 - (long)puVar1);
    }
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
    ptVar5 = (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (ptVar5 != (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        ptVar6 = ptVar5;
        std::thread::join();
        ptVar5 = ptVar6 + 1;
      } while (ptVar5 != (this->_worker).
                         super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      ptVar3 = (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (ptVar5 != ptVar3) {
        ptVar5 = ptVar3 + -1;
        do {
          if (ptVar5[1]._M_id._M_thread != 0) {
            std::terminate();
          }
          ptVar5 = ptVar5 + 1;
        } while (ptVar6 != ptVar5);
        (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar3;
      }
    }
  }
  return;
}

Assistant:

void ThreadPool::stop()
{
    clear();

    if( !_worker.empty() ) {
        _taskInfo.lock();

        std::fill( _exit.begin(), _exit.end(), 1 );
        std::fill( _run.begin(), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        for( std::vector < std::thread >::iterator thread = _worker.begin(); thread != _worker.end(); ++thread )
            thread->join();

        _worker.clear();
    }
}